

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::GetLocOffset
          (LivenessManager *this,uint32_t index,uint32_t agg_type_id)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this_02;
  reference ppTVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Float *flt_type;
  Type *comp_type;
  Vector *vec_type;
  Matrix *mat_type;
  Type **el_type;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range3;
  uint32_t cnt;
  uint32_t offset;
  Struct *struct_type;
  Array *arr_type;
  Type *agg_type;
  TypeManager *type_mgr;
  uint32_t agg_type_id_local;
  uint32_t index_local;
  LivenessManager *this_local;
  
  this_00 = context(this);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar4 = TypeManager::GetType(this_01,agg_type_id);
  iVar2 = (*pTVar4->_vptr_Type[0x18])();
  if ((Array *)CONCAT44(extraout_var,iVar2) == (Array *)0x0) {
    iVar2 = (*pTVar4->_vptr_Type[0x1e])();
    if ((Struct *)CONCAT44(extraout_var_00,iVar2) == (Struct *)0x0) {
      iVar2 = (*pTVar4->_vptr_Type[0x10])();
      if ((Matrix *)CONCAT44(extraout_var_01,iVar2) == (Matrix *)0x0) {
        iVar2 = (*pTVar4->_vptr_Type[0xe])();
        if ((Vector *)CONCAT44(extraout_var_02,iVar2) == (Vector *)0x0) {
          __assert_fail("vec_type && \"unexpected non-aggregate type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp"
                        ,0xa5,
                        "uint32_t spvtools::opt::analysis::LivenessManager::GetLocOffset(uint32_t, uint32_t) const"
                       );
        }
        pTVar4 = Vector::element_type((Vector *)CONCAT44(extraout_var_02,iVar2));
        iVar2 = (*pTVar4->_vptr_Type[0xc])();
        if ((((Float *)CONCAT44(extraout_var_03,iVar2) == (Float *)0x0) ||
            (uVar3 = Float::width((Float *)CONCAT44(extraout_var_03,iVar2)), uVar3 != 0x40)) ||
           (index < 2)) {
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        pTVar4 = Matrix::element_type((Matrix *)CONCAT44(extraout_var_01,iVar2));
        uVar3 = GetLocSize(this,pTVar4);
        this_local._4_4_ = index * uVar3;
      }
    }
    else {
      __range3._4_4_ = 0;
      __range3._0_4_ = 0;
      this_02 = Struct::element_types((Struct *)CONCAT44(extraout_var_00,iVar2));
      __end3 = std::
               vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               ::begin(this_02);
      el_type = (Type **)std::
                         vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                         ::end(this_02);
      while ((bVar1 = __gnu_cxx::operator!=
                                (&__end3,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                          *)&el_type), bVar1 &&
             (ppTVar5 = __gnu_cxx::
                        __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                        ::operator*(&__end3), (uint32_t)__range3 != index))) {
        uVar3 = GetLocSize(this,*ppTVar5);
        __range3._4_4_ = uVar3 + __range3._4_4_;
        __range3._0_4_ = (uint32_t)__range3 + 1;
        __gnu_cxx::
        __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
        ::operator++(&__end3);
      }
      this_local._4_4_ = __range3._4_4_;
    }
  }
  else {
    pTVar4 = Array::element_type((Array *)CONCAT44(extraout_var,iVar2));
    uVar3 = GetLocSize(this,pTVar4);
    this_local._4_4_ = index * uVar3;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t LivenessManager::GetLocOffset(uint32_t index,
                                       uint32_t agg_type_id) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* agg_type = type_mgr->GetType(agg_type_id);
  auto arr_type = agg_type->AsArray();
  if (arr_type) return index * GetLocSize(arr_type->element_type());
  auto struct_type = agg_type->AsStruct();
  if (struct_type) {
    uint32_t offset = 0u;
    uint32_t cnt = 0u;
    for (auto& el_type : struct_type->element_types()) {
      if (cnt == index) break;
      offset += GetLocSize(el_type);
      ++cnt;
    }
    return offset;
  }
  auto mat_type = agg_type->AsMatrix();
  if (mat_type) return index * GetLocSize(mat_type->element_type());
  auto vec_type = agg_type->AsVector();
  assert(vec_type && "unexpected non-aggregate type");
  auto comp_type = vec_type->element_type();
  auto flt_type = comp_type->AsFloat();
  if (flt_type && flt_type->width() == 64u && index >= 2u) return 1;
  return 0;
}